

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O3

uint32_t icu_63::CollationFastLatin::getSecondaries(uint32_t variableTop,uint32_t pair)

{
  uint32_t uVar1;
  uint uVar2;
  
  if (pair < 0x10000) {
    if (0xfff < pair) {
      uVar2 = pair & 0x3e0;
      uVar1 = uVar2 * 0x10000 + 0x2000c0;
      if (uVar2 < 0x180) {
        uVar1 = uVar2 + 0x20;
      }
      return uVar1;
    }
    uVar1 = 0xc0;
    if (pair <= variableTop) {
      uVar1 = 0;
      if (pair < 0xc00) {
        uVar1 = pair;
      }
      return uVar1;
    }
  }
  else {
    uVar1 = 0xc000c0;
    if ((pair & 0xffff) <= variableTop) {
      uVar1 = 0;
    }
    if (0xfff < (pair & 0xffff)) {
      uVar1 = (pair & 0x3e003e0) + 0x200020;
    }
  }
  return uVar1;
}

Assistant:

uint32_t
CollationFastLatin::getSecondaries(uint32_t variableTop, uint32_t pair) {
    if(pair <= 0xffff) {
        // one mini CE
        if(pair >= MIN_SHORT) {
            pair = getSecondariesFromOneShortCE(pair);
        } else if(pair > variableTop) {
            pair = COMMON_SEC_PLUS_OFFSET;
        } else if(pair >= MIN_LONG) {
            pair = 0;  // variable
        }
        // else special mini CE
    } else {
        uint32_t ce = pair & 0xffff;
        if(ce >= MIN_SHORT) {
            pair = (pair & TWO_SECONDARIES_MASK) + TWO_SEC_OFFSETS;
        } else if(ce > variableTop) {
            pair = TWO_COMMON_SEC_PLUS_OFFSET;
        } else {
            U_ASSERT(ce >= MIN_LONG);
            pair = 0;  // variable
        }
    }
    return pair;
}